

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schedules.cpp
# Opt level: O0

void CASC::Schedules::getSnakeTptpSatSchedule(Property *property,Schedule *quick)

{
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe7e0;
  allocator<char> *in_stack_ffffffffffffe800;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__a;
  char *in_stack_ffffffffffffe808;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe810;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  undefined1 local_1149 [40];
  allocator<char> local_1121;
  string local_1120 [39];
  allocator<char> local_10f9;
  string local_10f8 [39];
  allocator<char> local_10d1;
  string local_10d0 [39];
  allocator<char> local_10a9;
  string local_10a8 [39];
  allocator<char> local_1081;
  string local_1080 [39];
  allocator<char> local_1059;
  string local_1058 [39];
  allocator<char> local_1031;
  string local_1030 [39];
  allocator<char> local_1009;
  string local_1008 [39];
  allocator<char> local_fe1;
  string local_fe0 [39];
  allocator<char> local_fb9;
  string local_fb8 [39];
  allocator<char> local_f91;
  string local_f90 [39];
  allocator<char> local_f69;
  string local_f68 [39];
  allocator<char> local_f41;
  string local_f40 [39];
  allocator<char> local_f19;
  string local_f18 [39];
  allocator<char> local_ef1;
  string local_ef0 [39];
  allocator<char> local_ec9;
  string local_ec8 [39];
  allocator<char> local_ea1;
  string local_ea0 [39];
  allocator<char> local_e79;
  string local_e78 [39];
  allocator<char> local_e51;
  string local_e50 [39];
  allocator<char> local_e29;
  string local_e28 [39];
  allocator<char> local_e01;
  string local_e00 [39];
  allocator<char> local_dd9;
  string local_dd8 [39];
  allocator<char> local_db1;
  string local_db0 [39];
  allocator<char> local_d89;
  string local_d88 [39];
  allocator<char> local_d61;
  string local_d60 [39];
  allocator<char> local_d39;
  string local_d38 [39];
  allocator<char> local_d11;
  string local_d10 [39];
  allocator<char> local_ce9;
  string local_ce8 [39];
  allocator<char> local_cc1;
  string local_cc0 [39];
  allocator<char> local_c99;
  string local_c98 [39];
  allocator<char> local_c71;
  string local_c70 [39];
  allocator<char> local_c49;
  string local_c48 [39];
  allocator<char> local_c21;
  string local_c20 [39];
  allocator<char> local_bf9;
  string local_bf8 [39];
  allocator<char> local_bd1;
  string local_bd0 [39];
  allocator<char> local_ba9;
  string local_ba8 [39];
  allocator<char> local_b81;
  string local_b80 [39];
  allocator<char> local_b59;
  string local_b58 [39];
  allocator<char> local_b31;
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [39];
  allocator<char> local_ae1;
  string local_ae0 [39];
  allocator<char> local_ab9;
  string local_ab8 [39];
  allocator<char> local_a91;
  string local_a90 [39];
  allocator<char> local_a69;
  string local_a68 [39];
  allocator<char> local_a41;
  string local_a40 [39];
  allocator<char> local_a19;
  string local_a18 [39];
  allocator<char> local_9f1;
  string local_9f0 [39];
  allocator<char> local_9c9;
  string local_9c8 [39];
  allocator<char> local_9a1;
  string local_9a0 [39];
  allocator<char> local_979;
  string local_978 [39];
  allocator<char> local_951;
  string local_950 [39];
  allocator<char> local_929;
  string local_928 [39];
  allocator<char> local_901;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [39];
  allocator<char> local_861;
  string local_860 [39];
  allocator<char> local_839;
  string local_838 [39];
  allocator<char> local_811;
  string local_810 [39];
  allocator<char> local_7e9;
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [39];
  allocator<char> local_6a9;
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [39];
  allocator<char> local_609;
  string local_608 [39];
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator(&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator(&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator(&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator(&local_d39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator(&local_d61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator(&local_d89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator(&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator(&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_e50);
  std::allocator<char>::~allocator(&local_e51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_e78);
  std::allocator<char>::~allocator(&local_e79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ea0);
  std::allocator<char>::~allocator(&local_ea1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ec8);
  std::allocator<char>::~allocator(&local_ec9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_ef0);
  std::allocator<char>::~allocator(&local_ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_f18);
  std::allocator<char>::~allocator(&local_f19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_f40);
  std::allocator<char>::~allocator(&local_f41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator(&local_fb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_fe0);
  std::allocator<char>::~allocator(&local_fe1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator(&local_1009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::~allocator(&local_1031);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1058);
  std::allocator<char>::~allocator(&local_1059);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator(&local_1081);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             in_stack_ffffffffffffe808,in_stack_ffffffffffffe800);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_10a8);
  std::allocator<char>::~allocator(&local_10a9);
  __s = &local_10d1;
  __a = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_10f8);
  std::allocator<char>::~allocator(&local_10f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (local_10,in_stack_ffffffffffffe7d8);
  std::__cxx11::string::~string(local_1120);
  std::allocator<char>::~allocator(&local_1121);
  elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s,
             (allocator<char> *)__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (local_10,elem);
  std::__cxx11::string::~string((string *)(local_1149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1149);
  return;
}

Assistant:

void Schedules::getSnakeTptpSatSchedule(const Shell::Property& property, Schedule& quick) {
  // problemsFNT.txt
  // Champion singleton-schedule for 200000Mi
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=191324:si=on:rawr=on:rtra=on_0");
  // Improves by expected 1856.5193556018971 probs costing 191323 Mi
  // Sub-schedule for 50Mi strat cap / 400Mi overall limit
   quick.push("ott+10_1:32_drc=ordering:abs=on:br=off:urr=ec_only:i=50:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=37:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=48:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:1_drc=ordering:fsd=on:sp=occurrence:i=7:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=2:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("ott+2_1:1_drc=ordering:fsr=off:gsp=on:i=50:si=on:rawr=on:rtra=on_0");
  // Improves by expected 95.35596882712122 probs costing 388 Mi
  // Sub-schedule for 100Mi strat cap / 800Mi overall limit
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=100:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:28_drc=ordering:bd=off:bs=on:tgt=ground:i=101:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:5_drc=ordering:bd=off:tgt=full:i=99:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=75:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=99:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=59:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:tgt=ground:i=100:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:rp=on:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=100:si=on:rawr=on:rtra=on_0");
  // Improves by expected 12.8888583651196 probs costing 792 Mi
  // Sub-schedule for 500Mi strat cap / 4000Mi overall limit
   quick.push("ott+10_1:8_drc=ordering:bsd=on:fsd=on:lcm=predicate:nwc=5.0:s2a=on:s2at=1.5:spb=goal_then_units:i=176:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:gsp=on:lcm=predicate:i=138:si=on:rawr=on:rtra=on_0");
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=498:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_1:1_drc=off:nwc=5.0:slsq=on:slsqc=1:spb=goal_then_units:to=lpo:i=467:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=482:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:5_drc=ordering:bd=off:tgt=full:i=500:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=177:si=on:rawr=on:rtra=on_0");
   quick.push("ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=439:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_7:2_bd=preordered:drc=off:fd=preordered:fde=unused:fsr=off:slsq=on:slsqc=2:slsqr=5,8:sp=const_min:spb=units:to=lpo:i=355:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=388:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=211:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 27.24796872611255 probs costing 3976 Mi
  // Sub-schedule for 1000Mi strat cap / 8000Mi overall limit
   quick.push("ott+1_1:2_drc=ordering:i=920:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_1:7_drc=ordering:bd=off:i=934:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:50_bsr=unit_only:drc=off:fd=preordered:sp=frequency:i=747:si=on:rawr=on:rtra=on_0");
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=655:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=940:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_4:1_drc=ordering:br=off:fde=none:s2a=on:sd=2:sp=frequency:urr=on:i=981:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 11.014686867779822 probs costing 5327 Mi
  // Sub-schedule for 5000Mi strat cap / 40000Mi overall limit
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:2_drc=ordering:atotf=0.3:i=3735:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=4959:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=4756:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=4931:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=2134:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:1_drc=ordering:sp=const_frequency:i=2891:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=4585:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 19.448144622151943 probs costing 36935 Mi
  // Sub-schedule for 10000Mi strat cap / 80000Mi overall limit
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:2_drc=ordering:atotf=0.3:i=8004:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=9965:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=9877:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=9989:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 9.100420630309813 probs costing 61365 Mi
  // Sub-schedule for 50000Mi strat cap / 400000Mi overall limit
   quick.push("ott+3_1:1_drc=ordering:abs=on:anc=none:bs=on:fsr=off:spb=goal_then_units:i=44001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0");
   quick.push("ott+21_1:28_drc=ordering:afr=on:anc=all_dependent:bs=on:bsr=unit_only:nicw=on:sp=const_frequency:uhcvi=on:i=37001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=10187:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=38056:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:newcnf=on:nm=2:i=33239:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=predicate:gsp=on:nm=2:i=20987:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=49917:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=19144:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=27492:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=6101:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 13.362600076988887 probs costing 398190 Mi
  // Sub-schedule for 100000Mi strat cap / 800000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=91600:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=7127:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=99860:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=expand:i=96985:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=99648:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=99882:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbas=predicate:fmbsr=1.5:fmbsso=preprocessed_usage:nm=4:i=99913:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=28201:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0");
  // Improves by expected 6.347485436212229 probs costing 729797 Mi
  // Sub-schedule for 150000Mi strat cap / 1200000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=144582:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=104647:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=146146:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=expand:i=112867:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=133500:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:ins=2:i=145423:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=147928:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=146184:si=on:rawr=on:rtra=on_0");
  // Improves by expected 5.220673651207569 probs costing 1116524 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:atotf=0.5:bce=on:ins=1:sp=frequency:spb=units:i=325642:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=479034:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=452948:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=262660:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0");
  // Improves by expected 23.026595026749764 probs costing 3012587 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:i=305496:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=467380:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0");
  // Improves by expected 1.2113310912171895 probs costing 2260430 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=285611:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0");
  // Improves by expected 0.4363593202030057 probs costing 1274359 Mi
  // Overall score 2081.1804482430707 probs on average / budget 9091993 Mi
}